

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

void __thiscall type::type(type *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  (this->typeName)._M_string_length = 0;
  (this->typeName).field_2._M_local_buf[0] = '\0';
  this->numFields = '\0';
  (this->fieldsName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fieldsName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fieldsName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dir = (directory *)0x0;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,'\b');
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

type::type() {
    typeName = std::string(8, ' ');
}